

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O2

string * __thiscall
program_options::option_description::format_name_abi_cxx11_
          (string *__return_storage_ptr__,option_description *this)

{
  string *psVar1;
  char *pcVar2;
  allocator<char> local_39;
  string local_38 [32];
  
  if ((this->m_short_name)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>(local_38,"--",&local_39);
    psVar1 = (string *)std::__cxx11::string::append(local_38);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  }
  else {
    if ((this->m_long_names).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_long_names).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string(local_38,(string *)this);
    psVar1 = (string *)std::__cxx11::string::append((char *)local_38);
    pcVar2 = (char *)std::__cxx11::string::append(psVar1);
    psVar1 = (string *)std::__cxx11::string::append(pcVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  }
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string option_description::format_name() const
{
    if (!m_short_name.empty())
    {
        if (m_long_names.empty()) {
            return m_short_name;
        } else {
            return std::string(m_short_name)
                    .append(" [ --")
                    .append(*m_long_names.begin())
                    .append(" ]");
        }
    }
    return std::string("--").append(*m_long_names.begin());
}